

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_write_journal_header(Pager *pPager,uchar *zBuf)

{
  uchar *zPtr;
  uchar *zBuf_local;
  Pager *pPager_local;
  
  SyMemcpy(aJournalMagic,zBuf,8);
  SyBigEndianPack32(zBuf + 8,0);
  SyBigEndianPack32(zBuf + 0xc,pPager->cksumInit);
  SyBigEndianPack64(zBuf + 0x10,pPager->dbOrigSize);
  SyBigEndianPack32(zBuf + 0x18,pPager->iSectorSize);
  SyBigEndianPack32(zBuf + 0x1c,pPager->iPageSize);
  return 0;
}

Assistant:

static int pager_write_journal_header(Pager *pPager,unsigned char *zBuf)
{
	unsigned char *zPtr = zBuf;
	/* 8 bytes magic number */
	SyMemcpy(aJournalMagic,zPtr,sizeof(aJournalMagic));
	zPtr += sizeof(aJournalMagic);
	/* 4 bytes: Number of records in journal. */
	SyBigEndianPack32(zPtr,0);
	zPtr += 4;
	/* 4 bytes: Random number used to compute page checksum. */
	SyBigEndianPack32(zPtr,pPager->cksumInit);
	zPtr += 4;
	/* 8 bytes: Initial database page count. */
	SyBigEndianPack64(zPtr,pPager->dbOrigSize);
	zPtr += 8;
	/* 4 bytes: Sector size used by the process that wrote this journal. */
	SyBigEndianPack32(zPtr,(sxu32)pPager->iSectorSize);
	zPtr += 4;
	/* 4 bytes: Database page size. */
	SyBigEndianPack32(zPtr,(sxu32)pPager->iPageSize);
	return UNQLITE_OK;
}